

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O1

LIBSSH2_SESSION *
libssh2_session_init_ex
          (_func_void_ptr_size_t_void_ptr_ptr *my_alloc,_func_void_void_ptr_void_ptr_ptr *my_free,
          _func_void_ptr_void_ptr_size_t_void_ptr_ptr *my_realloc,void *abstract)

{
  LIBSSH2_SESSION *__s;
  code *pcVar1;
  code *pcVar2;
  code *pcVar3;
  void *local_30;
  
  pcVar1 = libssh2_default_alloc;
  if (my_alloc != (_func_void_ptr_size_t_void_ptr_ptr *)0x0) {
    pcVar1 = my_alloc;
  }
  local_30 = abstract;
  __s = (LIBSSH2_SESSION *)(*pcVar1)(0x11f80,&local_30);
  if (__s != (LIBSSH2_SESSION *)0x0) {
    pcVar2 = libssh2_default_realloc;
    if (my_realloc != (_func_void_ptr_void_ptr_size_t_void_ptr_ptr *)0x0) {
      pcVar2 = my_realloc;
    }
    pcVar3 = libssh2_default_free;
    if (my_free != (_func_void_void_ptr_void_ptr_ptr *)0x0) {
      pcVar3 = my_free;
    }
    memset(__s,0,0x11f80);
    __s->alloc = pcVar1;
    __s->free = pcVar3;
    __s->realloc = pcVar2;
    __s->send = _libssh2_send;
    __s->recv = _libssh2_recv;
    __s->abstract = local_30;
    __s->api_timeout = 0;
    __s->api_block_mode = 1;
    __s->state = 1;
    __s->fullpacket_required_type = 0;
    __s->packet_read_timeout = 0x3c;
    (__s->flag).quote_paths = 1;
    _libssh2_init_if_needed();
  }
  return __s;
}

Assistant:

LIBSSH2_API LIBSSH2_SESSION *
libssh2_session_init_ex(LIBSSH2_ALLOC_FUNC((*my_alloc)),
                        LIBSSH2_FREE_FUNC((*my_free)),
                        LIBSSH2_REALLOC_FUNC((*my_realloc)), void *abstract)
{
    LIBSSH2_ALLOC_FUNC((*local_alloc)) = libssh2_default_alloc;
    LIBSSH2_FREE_FUNC((*local_free)) = libssh2_default_free;
    LIBSSH2_REALLOC_FUNC((*local_realloc)) = libssh2_default_realloc;
    LIBSSH2_SESSION *session;

    if(my_alloc) {
        local_alloc = my_alloc;
    }
    if(my_free) {
        local_free = my_free;
    }
    if(my_realloc) {
        local_realloc = my_realloc;
    }

    session = local_alloc(sizeof(LIBSSH2_SESSION), &abstract);
    if(session) {
        memset(session, 0, sizeof(LIBSSH2_SESSION));
        session->alloc = local_alloc;
        session->free = local_free;
        session->realloc = local_realloc;
        session->send = _libssh2_send;
        session->recv = _libssh2_recv;
        session->abstract = abstract;
        session->api_timeout = 0; /* timeout-free API by default */
        session->api_block_mode = 1; /* blocking API by default */
        session->state = LIBSSH2_STATE_INITIAL_KEX;
        session->fullpacket_required_type = 0;
        session->packet_read_timeout = LIBSSH2_DEFAULT_READ_TIMEOUT;
        session->flag.quote_paths = 1; /* default behavior is to quote paths
                                          for the scp subsystem */
        _libssh2_debug((session, LIBSSH2_TRACE_TRANS,
                       "New session resource allocated"));
        _libssh2_init_if_needed();
    }
    return session;
}